

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcIShapeProfileDef::~IfcIShapeProfileDef(IfcIShapeProfileDef *this)

{
  ~IfcIShapeProfileDef
            ((IfcIShapeProfileDef *)
             &this[-1].super_IfcParameterizedProfileDef.super_IfcProfileDef.field_0x58);
  return;
}

Assistant:

IfcIShapeProfileDef() : Object("IfcIShapeProfileDef") {}